

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

bool testing::internal::BoolFromGTestEnv(char *flag,bool default_value)

{
  char *pcVar1;
  char *in_RDX;
  undefined1 local_38 [8];
  string env_var;
  
  FlagToEnvVar_abi_cxx11_((string *)local_38,(internal *)flag,in_RDX);
  pcVar1 = getenv((char *)local_38);
  if ((pcVar1 != (char *)0x0) && (default_value = true, *pcVar1 == '0')) {
    default_value = pcVar1[1] != '\0';
  }
  std::__cxx11::string::~string((string *)local_38);
  return default_value;
}

Assistant:

bool BoolFromGTestEnv(const char* flag, bool default_value) {
#if defined(GTEST_GET_BOOL_FROM_ENV_)
  return GTEST_GET_BOOL_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  return string_value == NULL ?
      default_value : strcmp(string_value, "0") != 0;
#endif  // defined(GTEST_GET_BOOL_FROM_ENV_)
}